

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_BasicPartialInequivalencyTest_Test::
TestBody(MessageDifferencerTest_BasicPartialInequivalencyTest_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_880;
  Message local_878;
  string local_870;
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  TestAllTypes msg1;
  TestAllTypes msg2;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&msg1);
  proto2_unittest::TestAllTypes::TestAllTypes(&msg2);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&msg1);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&msg2);
  msg1.field_0._impl_.optional_int32_ = -1;
  msg1.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
       msg1.field_0._impl_._has_bits_.has_bits_[0]._1_1_ | 0x10;
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::set_message_field_comparison(&differencer,EQUIVALENT);
  util::MessageDifferencer::set_scope(&differencer,PARTIAL);
  bVar1 = util::MessageDifferencer::Compare(&differencer,&msg1.super_Message,&msg2.super_Message);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message(&local_878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_870,(internal *)&gtest_ar_,(AssertionResult *)0xf0d901,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x348,local_870._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_880,&local_878);
    testing::internal::AssertHelper::~AssertHelper(&local_880);
    std::__cxx11::string::~string((string *)&local_870);
    if (local_878.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_878.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestAllTypes::~TestAllTypes(&msg2);
  proto2_unittest::TestAllTypes::~TestAllTypes(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, BasicPartialInequivalencyTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  msg1.set_optional_int32(-1);

  // Compare
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
}